

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O3

float __thiscall lunasvg::Font::ascent(Font *this)

{
  plutovg_font_face_t *face;
  float fVar1;
  float ascent;
  float local_c;
  
  local_c = 0.0;
  fVar1 = 0.0;
  if ((0.0 < this->m_size) && (face = (this->m_face).m_face, face != (plutovg_font_face_t *)0x0)) {
    plutovg_font_face_get_metrics
              (face,this->m_size,&local_c,(float *)0x0,(float *)0x0,(plutovg_rect_t *)0x0);
    fVar1 = local_c;
  }
  return fVar1;
}

Assistant:

float Font::ascent() const
{
    float ascent = 0;
    if(m_size > 0.f && !m_face.isNull())
        plutovg_font_face_get_metrics(m_face.get(), m_size, &ascent, nullptr, nullptr, nullptr);
    return ascent;
}